

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void env_routine_put(Routine r,int line,Environment *env)

{
  Object value;
  undefined4 uStack_5c;
  Object record;
  Record *match;
  Environment *env_local;
  int line_local;
  
  record.field_1.routine.code.statements = (Statement *)env_match(r.name,env);
  if ((Record *)record.field_1.routine.code.statements != (Record *)0x0) {
    if ((((Record *)record.field_1.routine.code.statements)->object).type == OBJECT_ROUTINE) {
      printf("\x1b[31m\n[Runtime Error] [Line:%d] Routine %s is already defined!\x1b[0m",
             (ulong)(uint)line,r.name);
    }
    else {
      printf("\x1b[31m\n[Runtime Error] [Line:%d] Identifer %s cannot be redefined as a routine in the same scope!\x1b[0m"
             ,(ulong)(uint)line,r.name);
    }
    stop();
  }
  memcpy(&record,&r,0x38);
  value._4_4_ = uStack_5c;
  value.type = 3;
  value.field_1.instance = (Instance *)record._0_8_;
  value.field_1._8_8_ = record.field_1.instance;
  value.field_1._16_8_ = record.field_1.arr.values;
  value.field_1._24_8_ = record.field_1._16_8_;
  value.field_1._32_8_ = record.field_1.routine.arguments;
  value.field_1._40_8_ = record.field_1._32_8_;
  value.field_1.routine.code.statements = record.field_1.container.constructor.statements;
  rec_new(r.name,value,env);
  return;
}

Assistant:

void env_routine_put(Routine r, int line, Environment *env){
    Record *match = env_match(r.name, env);
    if(match != NULL){
        if(match->object.type != OBJECT_ROUTINE){
            printf(runtime_error("Identifer %s cannot be redefined as a routine in the same scope!"), line, r.name);
        }
        else{
            printf(runtime_error("Routine %s is already defined!"), line, r.name);
        }
        stop();
    }

    Object record;
    record.type = OBJECT_ROUTINE;
    record.routine = r;

    rec_new(r.name, record, env);
}